

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.cpp
# Opt level: O0

Tick Js::Tick::Now(void)

{
  uint64 luDelta;
  uint64 luCurrent;
  
  luDelta = s_luBegin;
  QueryPerformanceCounter((LARGE_INTEGER *)&luDelta);
  luDelta = s_DEBUG_luStart + s_DEBUG_luSkip + luDelta;
  Tick((Tick *)&luCurrent,luDelta - s_luBegin);
  return (Tick)luCurrent;
}

Assistant:

Tick Tick::Now()
    {
        // Determine our current time
        uint64 luCurrent = s_luBegin;
        /* Verify( */ QueryPerformanceCounter((LARGE_INTEGER *) &luCurrent);

#if DBG
        luCurrent += s_DEBUG_luStart + s_DEBUG_luSkip;
#endif

        // Create a Tick instance, using our delta since we started tracking time.
        uint64 luDelta = luCurrent - s_luBegin;
        return Tick(luDelta);
    }